

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  char *ptr_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  uint32_t uVar4;
  MessageLite *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  ParseContext *s;
  ulong uVar7;
  int iVar8;
  string_view val;
  char *ptr_local;
  bool was_packed_on_wire;
  uint32_t tag;
  InternalMetadata *local_118;
  MessageLite *local_110;
  char *p;
  uint64_t tmp;
  string payload;
  ExtensionInfo extension;
  ParseContext tmp_ctx;
  
  payload._M_dataplus._M_p = (pointer)&payload.field_2;
  payload._M_string_length = 0;
  payload.field_2._M_local_buf[0] = '\0';
  iVar8 = 0;
  uVar7 = 0;
  ptr_local = ptr;
  local_118 = metadata;
  local_110 = extendee;
  do {
    while( true ) {
      bVar3 = ParseContext::Done(ctx,&ptr_local);
      pcVar6 = ptr_local;
      if (bVar3) goto LAB_0033ca25;
      ptr_00 = ptr_local + 1;
      tag = (uint32_t)(byte)*ptr_local;
      if (tag == 0x1a) break;
      if (*ptr_local == 0x10) {
        ptr_local = ptr_00;
        ptr_local = ParseBigVarint(ptr_00,&tmp);
        uVar4 = (uint32_t)tmp;
        if ((ptr_local == (char *)0x0) || ((uint32_t)tmp == 0)) goto LAB_0033ca15;
        if (iVar8 == 0) {
          iVar8 = 1;
          uVar7 = (ulong)(uint32_t)tmp;
        }
        else if (iVar8 == 2) {
          extension.descriptor = (FieldDescriptor *)0x0;
          extension.lazy_eager_verify_func = (LazyEagerVerifyFnType)0x0;
          extension.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
          extension.field_6.enum_validity_check.arg = (void *)0x0;
          extension.message = (MessageLite *)0x0;
          extension.number = 0;
          extension.type = '\0';
          extension.is_repeated = false;
          extension.is_packed = false;
          extension.is_lazy = kUndefined;
          s = ctx;
          bVar3 = FindExtension(this,2,(uint32_t)tmp,local_110,ctx,&extension,&was_packed_on_wire);
          sVar2 = payload._M_string_length;
          _Var1 = payload._M_dataplus;
          if (bVar3) {
            if (extension.is_repeated == true) {
              this_00 = AddMessage(this,uVar4,'\v',extension.field_6.message_info.prototype,
                                   extension.descriptor);
            }
            else {
              this_00 = MutableMessage(this,uVar4,'\v',extension.field_6.message_info.prototype,
                                       extension.descriptor);
            }
            ParseContext::ParseContext<std::__cxx11::string&>(&tmp_ctx,ctx,&p,&payload);
            pcVar6 = MessageLite::_InternalParse(this_00,p,&tmp_ctx);
            if (pcVar6 == (char *)0x0) goto LAB_0033ca15;
            iVar8 = 3;
            uVar7 = (ulong)uVar4;
            if (tmp_ctx.super_EpsCopyInputStream.last_tag_minus_1_ != 0) goto LAB_0033ca15;
          }
          else {
            pbVar5 = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>(local_118);
            val._M_str = (char *)pbVar5;
            val._M_len = (size_t)_Var1._M_p;
            WriteLengthDelimited((internal *)(ulong)uVar4,(uint32_t)sVar2,val,(string *)s);
            iVar8 = 3;
            uVar7 = (ulong)uVar4;
          }
        }
      }
      else {
        ptr_local = ptr_00;
        ptr_local = ReadTag(pcVar6,&tag,0);
        if (((ulong)tag == 0) || ((tag & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          pcVar6 = ptr_local;
          goto LAB_0033ca25;
        }
        ptr_local = ParseField(this,(ulong)tag,ptr_local,local_110,local_118,ctx);
LAB_0033c8e8:
        if (ptr_local == (char *)0x0) goto LAB_0033ca15;
      }
    }
    if (iVar8 == 1) {
      ptr_local = ptr_00;
      ptr_local = ParseField(this,uVar7 * 8 + 2,ptr_00,local_110,local_118,ctx);
      iVar8 = 3;
      goto LAB_0033c8e8;
    }
    tmp_ctx.super_EpsCopyInputStream.limit_end_ =
         (char *)&tmp_ctx.super_EpsCopyInputStream.next_chunk_;
    tmp_ctx.super_EpsCopyInputStream.buffer_end_ = (char *)0x0;
    tmp_ctx.super_EpsCopyInputStream.next_chunk_._0_1_ = 0;
    ptr_local = ptr_00;
    uVar4 = ReadSize(&ptr_local);
    if ((ptr_local == (char *)0x0) ||
       (ptr_local = EpsCopyInputStream::ReadString
                              (&ctx->super_EpsCopyInputStream,ptr_local,uVar4,(string *)&tmp_ctx),
       ptr_local == (char *)0x0)) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (iVar8 == 0) {
        std::__cxx11::string::operator=((string *)&payload,(string *)&tmp_ctx);
        iVar8 = 2;
      }
    }
    std::__cxx11::string::~string((string *)&tmp_ctx);
  } while (bVar3);
LAB_0033ca15:
  pcVar6 = (char *)0x0;
LAB_0033ca25:
  std::__cxx11::string::~string((string *)&payload);
  return pcVar6;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  enum class State { kNoTag, kHasType, kHasPayload, kDone };
  State state = State::kNoTag;

  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      // We should fail parsing if type id is 0 after cast to uint32.
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                     static_cast<uint32_t>(tmp) != 0);
      if (state == State::kNoTag) {
        type_id = static_cast<uint32_t>(tmp);
        state = State::kHasType;
      } else if (state == State::kHasPayload) {
        type_id = static_cast<uint32_t>(tmp);
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools. Spawn a new
          // ParseContext inheriting those attributes.
          ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        state = State::kDone;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (state == State::kHasType) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        state = State::kDone;
      } else {
        std::string tmp;
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        if (state == State::kNoTag) {
          payload = std::move(tmp);
          state = State::kHasPayload;
        }
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}